

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void expectEqualIssues(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *issues,LoggerPtr *logger)

{
  ulong uVar1;
  const_reference lhs;
  char *pcVar2;
  ulong __n;
  unsigned_long local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  
  gtest_ar_1._0_8_ =
       (long)(issues->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(issues->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 5;
  local_70 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"issues.size()","logger->issueCount()",
             (unsigned_long *)&gtest_ar_1,&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xdd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  __n = 0;
  while( true ) {
    uVar1 = libcellml::Logger::issueCount();
    if ((uVar1 <= __n) ||
       ((ulong)((long)(issues->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(issues->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= __n)) break;
    lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(issues,__n);
    libcellml::Logger::issue((ulong)&local_70);
    libcellml::Issue::description_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"issues.at(i)","logger->issue(i)->description()",lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar2 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0xdf,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    __n = __n + 1;
  }
  return;
}

Assistant:

void expectEqualIssues(const std::vector<std::string> &issues, const libcellml::LoggerPtr &logger)

{
    EXPECT_EQ(issues.size(), logger->issueCount());
    for (size_t i = 0; i < logger->issueCount() && i < issues.size(); ++i) {
        EXPECT_EQ(issues.at(i), logger->issue(i)->description());
    }
}